

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSwitch
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Switch *curr,
          optional<wasm::Type> labelType)

{
  bool bVar1;
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this_00;
  Name *pNVar2;
  Type *pTVar3;
  Expression **ppEVar4;
  Type local_b8;
  uintptr_t local_b0;
  BasicType local_a4;
  size_t local_a0;
  char *local_98;
  uintptr_t local_90;
  Type local_88;
  uintptr_t local_80;
  size_t local_78;
  Name label;
  Iterator __end3;
  Iterator __begin3;
  ArenaVector<wasm::Name> *__range3;
  Type local_30;
  Type glb;
  Switch *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::Type> labelType_local;
  
  this_local = labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
  labelType_local.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_1_ =
       labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  glb.id = (uintptr_t)curr;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (!bVar1) {
    local_30 = getLabelType(this,(Name)((IString *)(glb.id + 0x30))->str);
    this_00 = (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(glb.id + 0x10);
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::begin(this_00);
    join_0x00000010_0x00000000_ = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::end(this_00)
    ;
    while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator!=
                             ((Iterator *)&__end3.index,(Iterator *)&label.super_IString.str._M_str)
          , bVar1) {
      pNVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                         ((Iterator *)&__end3.index);
      local_a0 = (pNVar2->super_IString).str._M_len;
      local_98 = (pNVar2->super_IString).str._M_str;
      local_88.id = local_30.id;
      local_78 = local_a0;
      label.super_IString.str._M_len = (size_t)local_98;
      local_90 = (uintptr_t)getLabelType(this,(Name)(pNVar2->super_IString).str);
      local_80 = (uintptr_t)wasm::Type::getGreatestLowerBound(local_88,(Type)local_90);
      local_30 = (Type)local_80;
      ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator++
                ((Iterator *)&__end3.index);
    }
    std::optional<wasm::Type>::operator=((optional<wasm::Type> *)&this_local,&local_30);
  }
  pTVar3 = std::optional<wasm::Type>::operator*((optional<wasm::Type> *)&this_local);
  local_a4 = none;
  bVar1 = wasm::Type::operator!=(pTVar3,&local_a4);
  if (bVar1) {
    ppEVar4 = (Expression **)(glb.id + 0x40);
    pTVar3 = std::optional<wasm::Type>::operator*((optional<wasm::Type> *)&this_local);
    local_b0 = pTVar3->id;
    note(this,ppEVar4,(Type)local_b0);
  }
  ppEVar4 = (Expression **)(glb.id + 0x48);
  wasm::Type::Type(&local_b8,i32);
  note(this,ppEVar4,local_b8);
  return;
}

Assistant:

void visitSwitch(Switch* curr, std::optional<Type> labelType = std::nullopt) {
    if (!labelType) {
      Type glb = getLabelType(curr->default_);
      for (auto label : curr->targets) {
        glb = Type::getGreatestLowerBound(glb, getLabelType(label));
      }
      labelType = glb;
    }
    if (*labelType != Type::none) {
      note(&curr->value, *labelType);
    }
    note(&curr->condition, Type::i32);
  }